

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_strand_array.h
# Opt level: O3

void __thiscall
embree::sse2::HeuristicStrandSplit::splitFallback
          (HeuristicStrandSplit *this,Set *set,PrimInfoRange *lset,PrimInfoRange *rset)

{
  ulong uVar1;
  Geometry *pGVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  undefined1 auVar15 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar6 = set->_begin;
  uVar1 = set->_end;
  uVar7 = uVar1 + uVar6 >> 1;
  lVar8 = uVar7 - uVar6;
  aVar14 = _DAT_01f7aa00;
  aVar16 = _DAT_01f7a9f0;
  aVar17 = _DAT_01f7aa00;
  aVar18 = _DAT_01f7a9f0;
  if (uVar6 <= uVar7 && lVar8 != 0) {
    uVar9 = uVar6 << 5 | 0x1c;
    do {
      pGVar2 = (this->scene->geometries).items[*(uint *)((long)this->prims + (uVar9 - 0x10))].ptr;
      (*(pGVar2->super_RefCount)._vptr_RefCount[0x39])
                (local_58,pGVar2,(ulong)*(uint *)((long)&(this->prims->lower).field_0 + uVar9));
      aVar16.m128 = (__m128)minps(aVar16.m128,local_58);
      aVar14.m128 = (__m128)maxps(aVar14.m128,local_48);
      fVar10 = local_58._0_4_ + local_48._0_4_;
      fVar11 = local_58._4_4_ + local_48._4_4_;
      fVar12 = local_58._8_4_ + local_48._8_4_;
      fVar13 = local_58._12_4_ + local_48._12_4_;
      auVar15._4_4_ = fVar11;
      auVar15._0_4_ = fVar10;
      auVar15._8_4_ = fVar12;
      auVar15._12_4_ = fVar13;
      aVar18.m128 = (__m128)minps(aVar18.m128,auVar15);
      auVar3._4_4_ = fVar11;
      auVar3._0_4_ = fVar10;
      auVar3._8_4_ = fVar12;
      auVar3._12_4_ = fVar13;
      aVar17.m128 = (__m128)maxps(aVar17.m128,auVar3);
      uVar9 = uVar9 + 0x20;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar16;
  (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar14;
  (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar18;
  (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar17;
  (lset->super_range<unsigned_long>)._begin = uVar6;
  (lset->super_range<unsigned_long>)._end = uVar7;
  local_b8._0_4_ = (undefined4)DAT_01f7aa00;
  local_b8._4_4_ = DAT_01f7aa00._4_4_;
  fStack_b0 = DAT_01f7aa00._8_4_;
  fStack_ac = DAT_01f7aa00._12_4_;
  lVar8 = uVar1 - uVar7;
  aVar14 = _DAT_01f7a9f0;
  aVar16 = _DAT_01f7aa00;
  aVar17 = _DAT_01f7a9f0;
  if (uVar7 <= uVar1 && lVar8 != 0) {
    uVar6 = uVar7 << 5 | 0x1c;
    do {
      pGVar2 = (this->scene->geometries).items[*(uint *)((long)this->prims + (uVar6 - 0x10))].ptr;
      (*(pGVar2->super_RefCount)._vptr_RefCount[0x39])
                (local_58,pGVar2,(ulong)*(uint *)((long)&(this->prims->lower).field_0 + uVar6));
      aVar17.m128 = (__m128)minps(aVar17.m128,local_58);
      aVar16.m128 = (__m128)maxps(aVar16.m128,local_48);
      fVar10 = local_58._0_4_ + local_48._0_4_;
      fVar11 = local_58._4_4_ + local_48._4_4_;
      fVar12 = local_58._8_4_ + local_48._8_4_;
      fVar13 = local_58._12_4_ + local_48._12_4_;
      auVar4._4_4_ = fVar11;
      auVar4._0_4_ = fVar10;
      auVar4._8_4_ = fVar12;
      auVar4._12_4_ = fVar13;
      aVar14.m128 = (__m128)minps(aVar14.m128,auVar4);
      auVar5._4_4_ = fVar11;
      auVar5._0_4_ = fVar10;
      auVar5._8_4_ = fVar12;
      auVar5._12_4_ = fVar13;
      auVar15 = maxps(_local_b8,auVar5);
      local_b8._0_4_ = auVar15._0_4_;
      local_b8._4_4_ = auVar15._4_4_;
      fStack_b0 = auVar15._8_4_;
      fStack_ac = auVar15._12_4_;
      uVar6 = uVar6 + 0x20;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar17;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128 = aVar16;
  (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar14;
  *(undefined4 *)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_b8._0_4_;
  *(undefined4 *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 4) =
       local_b8._4_4_;
  *(float *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) = fStack_b0;
  *(float *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 0xc) = fStack_ac;
  (rset->super_range<unsigned_long>)._begin = uVar7;
  (rset->super_range<unsigned_long>)._end = uVar1;
  return;
}

Assistant:

void splitFallback(const Set& set, PrimInfoRange& lset, PrimInfoRange& rset)
      {
        const size_t begin = set.begin();
        const size_t end   = set.end();
        const size_t center = (begin + end)/2;
        
        CentGeomBBox3fa left(empty);
        for (size_t i=begin; i<center; i++)
          left.extend(bounds(prims[i]));
        new (&lset) PrimInfoRange(begin,center,left);
        
        CentGeomBBox3fa right(empty);
        for (size_t i=center; i<end; i++)
          right.extend(bounds(prims[i]));	
        new (&rset) PrimInfoRange(center,end,right);
      }